

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O3

List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
__thiscall
Js::Utf8SourceInfo::EnsureTopLevelFunctionInfoList(Utf8SourceInfo *this,Recycler *recycler)

{
  List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  Type *addr;
  
  pLVar1 = (this->topLevelFunctionInfoList).ptr;
  if (pLVar1 != (List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)0x0) {
    return pLVar1;
  }
  addr = &this->topLevelFunctionInfoList;
  pLVar1 = JsUtil::
           List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::New(recycler,4);
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pLVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return addr->ptr;
}

Assistant:

JsUtil::List<FunctionInfo *, Recycler> *
    Utf8SourceInfo::EnsureTopLevelFunctionInfoList(Recycler * recycler)
    {
        if (this->topLevelFunctionInfoList == nullptr)
        {
            this->topLevelFunctionInfoList = JsUtil::List<FunctionInfo *, Recycler>::New(recycler);
        }
        return this->topLevelFunctionInfoList;
    }